

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall
asmjit::ZoneVectorBase::_reserve(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  Block *pBVar1;
  Zone *pZVar2;
  char cVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sbyte sVar7;
  Error EVar8;
  Slot *pSVar10;
  sbyte sVar11;
  ZoneHeap *pZVar12;
  ZoneHeap *pZVar13;
  Block *pBVar14;
  Block *newLength;
  size_t extraout_RDX;
  size_t size;
  ZoneHeap *sizeOfT_00;
  ZoneHeap *extraout_RDX_00;
  Slot *pSVar15;
  ulong *puVar16;
  ulong extraout_RDX_01;
  ZoneHeap *extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  ZoneVectorBase *unaff_RBX;
  ZoneHeap *unaff_RBP;
  ZoneHeap *pZVar17;
  uint uVar18;
  ZoneHeap *pZVar19;
  ZoneHeap *pZVar20;
  ZoneHeap *pZVar21;
  ZoneHeap *pZVar22;
  ulong in_R8;
  ulong uVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ZoneHeap *pZVar30;
  Slot *pSVar31;
  ZoneHeap *pZVar32;
  uint8_t *puVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  size_t allocatedBytes;
  size_t sStack_120;
  ZoneHeap *pZStack_118;
  ZoneHeap *pZStack_110;
  ZoneHeap *pZStack_108;
  ZoneHeap *pZStack_f8;
  size_t sStack_f0;
  ZoneHeap *pZStack_e8;
  ZoneHeap *pZStack_e0;
  ZoneHeap *pZStack_d8;
  ZoneHeap *pZStack_d0;
  undefined8 uStack_c8;
  code *pcStack_c0;
  uint uStack_b4;
  ZoneHeap *pZStack_b0;
  ZoneHeap *pZStack_a8;
  ZoneHeap *pZStack_a0;
  ZoneHeap *pZStack_98;
  ZoneHeap *pZStack_90;
  ZoneHeap *pZStack_88;
  ZoneHeap *pZStack_78;
  ZoneVectorBase *pZStack_68;
  ZoneHeap *pZStack_60;
  size_t sStack_58;
  code *pcStack_50;
  ZoneHeap *local_40;
  ulong local_38;
  uint uVar9;
  
  pZVar30 = (ZoneHeap *)this->_capacity;
  pZVar12 = (ZoneHeap *)0x0;
  if (n <= pZVar30) {
    return 0;
  }
  pZVar19 = (ZoneHeap *)(n * sizeOfT);
  if (pZVar19 < n) {
    return 1;
  }
  if (heap->_zone == (Zone *)0x0) {
    pcStack_50 = (code *)0x11956b;
    _reserve();
    pZVar22 = (ZoneHeap *)this;
LAB_0011956b:
    pcStack_50 = (code *)0x119570;
    _reserve();
LAB_00119570:
    pcStack_50 = (code *)0x119575;
    _reserve();
  }
  else {
    pcStack_50 = (code *)0x11947f;
    pZVar22 = heap;
    unaff_RBP = (ZoneHeap *)ZoneHeap::_alloc(heap,(size_t)pZVar19,&local_38);
    if (unaff_RBP == (ZoneHeap *)0x0) {
      return 1;
    }
    pZVar19 = (ZoneHeap *)this->_data;
    size = this->_length;
    if (size != 0) {
      pcStack_50 = (code *)0x1194ae;
      pZVar22 = unaff_RBP;
      local_40 = heap;
      memcpy(unaff_RBP,pZVar19,size * sizeOfT);
      size = extraout_RDX;
      heap = local_40;
    }
    unaff_RBX = this;
    if (pZVar19 == (ZoneHeap *)0x0) {
LAB_00119536:
      pZVar12 = (ZoneHeap *)0x0;
      this->_capacity = local_38 / sizeOfT;
      if (n <= local_38 / sizeOfT) {
        this->_data = unaff_RBP;
        return 0;
      }
      goto LAB_0011956b;
    }
    if (heap->_zone == (Zone *)0x0) goto LAB_00119570;
    pZVar30 = (ZoneHeap *)((long)pZVar30 * sizeOfT);
    if (pZVar30 != (ZoneHeap *)0x0) {
      if (pZVar30 < (ZoneHeap *)0x201) {
        if (pZVar30 < (ZoneHeap *)0x81) {
          uVar9 = (uint)((ulong)((long)pZVar30[0x55555555]._slots + 0x17U) >> 5);
        }
        else {
          uVar9 = (int)((ulong)((long)pZVar30[0xaaaaaaa9]._slots + 0x17U) >> 6) + 4;
        }
      }
      else {
        uVar9 = 0;
      }
      if (pZVar30 < (ZoneHeap *)0x201) {
        pZVar19->_zone = (Zone *)heap->_slots[uVar9];
        heap->_slots[uVar9] = (Slot *)pZVar19;
      }
      else {
        pcStack_50 = (code *)0x119536;
        pZVar22 = heap;
        ZoneHeap::_releaseDynamic(heap,pZVar19,size);
      }
      goto LAB_00119536;
    }
  }
  pcStack_50 = _resize;
  _reserve();
  pZVar20 = (ZoneHeap *)pZVar22->_slots[0];
  pZStack_68 = unaff_RBX;
  pZStack_60 = heap;
  sStack_58 = n;
  pcStack_50 = (code *)sizeOfT;
  if (pZVar12 <= (ZoneHeap *)pZVar22->_slots[1]) {
LAB_00119595:
    if (pZVar20 <= pZVar12 && (long)pZVar12 - (long)pZVar20 != 0) {
      pZStack_78 = (ZoneHeap *)0x1195b2;
      memset((uint8_t **)((long)&pZVar22->_zone->_ptr + (long)pZVar20 * (long)sizeOfT_00),0,
             ((long)pZVar12 - (long)pZVar20) * (long)sizeOfT_00);
    }
    pZVar22->_slots[0] = (Slot *)pZVar12;
    return 0;
  }
  pZVar13 = (ZoneHeap *)((long)pZVar12 - (long)pZVar20);
  pZStack_78 = (ZoneHeap *)0x1195d5;
  pZVar21 = pZVar22;
  EVar8 = _grow((ZoneVectorBase *)pZVar22,pZVar19,(size_t)sizeOfT_00,(size_t)pZVar13);
  if (EVar8 != 0) {
    return EVar8;
  }
  if (pZVar12 <= (ZoneHeap *)pZVar22->_slots[1]) goto LAB_00119595;
  pZStack_78 = (ZoneHeap *)ZoneBitVector::_resize;
  _resize();
  pZVar32 = sizeOfT_00;
  pZStack_a0 = pZVar12;
  pZStack_98 = pZVar20;
  pZStack_90 = pZVar30;
  pZStack_88 = pZVar22;
  pZStack_78 = unaff_RBP;
  if (pZVar13 < extraout_RDX_00) {
    pcStack_c0 = (code *)0x119874;
    ZoneBitVector::_resize();
    pZVar17 = unaff_RBP;
    pZVar21 = pZVar22;
LAB_00119874:
    bVar4 = false;
LAB_001196c3:
    if (!bVar4) {
      return 1;
    }
LAB_001196d0:
    pZVar19 = pZVar20;
    pZVar20 = (ZoneHeap *)((ulong)pZVar17 >> 6);
    uVar9 = (uint)pZVar12 & 0x3f;
    sVar7 = (sbyte)uVar9;
    pSVar15 = (Slot *)-(in_R8 & 0xff);
    pZVar17 = (ZoneHeap *)((ulong)pZVar17 & 0x3f);
    if (pZVar17 != (ZoneHeap *)0x0) {
      pZVar22 = (ZoneHeap *)((ulong)pZVar12 >> 6);
      sVar11 = 0;
      if ((pZVar20 == pZVar22) && (sVar11 = sVar7, uVar9 <= (uint)pZVar17)) {
        pcStack_c0 = (code *)0x11989e;
        ZoneBitVector::_resize();
LAB_0011989e:
        pcStack_c0 = (code *)0x1198a3;
        ZoneBitVector::_resize();
        goto LAB_001198a3;
      }
      pZVar30->_slots[(long)((long)&pZVar20[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)pZVar30->_slots[(long)((long)&pZVar20[-1]._dynamicBlocks + 7)] |
                   (long)pSVar15 << (sVar11 - (char)pZVar17 & 0x3fU));
      pZVar20 = (ZoneHeap *)((long)&pZVar20->_zone + 1);
    }
    auVar6 = _DAT_00135a50;
    auVar5 = _DAT_00135a40;
    uVar23 = (ulong)(pZVar12->_slots + 7) >> 6;
    lVar27 = uVar23 - 1;
    uVar26 = (ulong)((ZoneHeap *)(lVar27 * 0x40) == pZVar12);
    pZVar19 = (ZoneHeap *)(lVar27 - uVar26);
    if (pZVar20 <= pZVar19) {
      puVar24 = (undefined1 *)(uVar23 - uVar26);
      puVar25 = (undefined1 *)((long)&pZVar20->_zone + 1);
      if (puVar24 <= puVar25) {
        puVar24 = puVar25;
      }
      puVar25 = puVar24 + (-1 - (long)pZVar20);
      auVar34._8_4_ = (int)puVar25;
      auVar34._0_8_ = puVar25;
      auVar34._12_4_ = (int)((ulong)puVar25 >> 0x20);
      uVar26 = 0;
      auVar34 = auVar34 ^ _DAT_00135a50;
      do {
        auVar36._8_4_ = (int)uVar26;
        auVar36._0_8_ = uVar26;
        auVar36._12_4_ = (int)(uVar26 >> 0x20);
        auVar36 = (auVar36 | auVar5) ^ auVar6;
        if ((bool)(~(auVar36._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar36._0_4_ ||
                    auVar34._4_4_ < auVar36._4_4_) & 1)) {
          pZVar30->_slots[(long)pZVar20->_slots + (uVar26 - 9)] = pSVar15;
        }
        if ((auVar36._12_4_ != auVar34._12_4_ || auVar36._8_4_ <= auVar34._8_4_) &&
            auVar36._12_4_ <= auVar34._12_4_) {
          pZVar30->_slots[(long)pZVar20->_slots + (uVar26 - 8)] = pSVar15;
        }
        uVar26 = uVar26 + 2;
      } while (((ulong)(puVar24 + (1 - (long)pZVar20)) & 0xfffffffffffffffe) != uVar26);
    }
    if (((ulong)pZVar12 & 0x3f) == 0) goto LAB_00119827;
    puVar16 = (ulong *)((long)pZVar19 * 8 + (long)pZVar30);
  }
  else {
    pZVar17 = (ZoneHeap *)pZVar21->_slots[0];
    pZVar12 = extraout_RDX_00;
    if (pZVar17 < extraout_RDX_00) {
      pZVar30 = (ZoneHeap *)pZVar21->_zone;
      if (extraout_RDX_00 <= (ZoneHeap *)pZVar21->_slots[1]) goto LAB_001196d0;
      pZVar32 = (ZoneHeap *)((ulong)((long)pZVar13->_slots + 0x37) & 0xffffffffffffffc0);
      if (pZVar32 < extraout_RDX_00) goto LAB_00119874;
      if (pZVar19->_zone == (Zone *)0x0) {
        pcStack_c0 = (code *)0x119880;
        ZoneBitVector::_resize();
LAB_00119880:
        bVar4 = false;
        in_R8 = (ulong)uStack_b4;
        pZVar20 = pZVar19;
        pZVar30 = pZStack_b0;
        goto LAB_001196c3;
      }
      uStack_b4 = (uint)in_R8;
      pZVar20 = (ZoneHeap *)((ulong)pZVar32 >> 3);
      pcStack_c0 = (code *)0x11965a;
      pZVar22 = pZVar19;
      pZStack_b0 = pZVar30;
      pZVar30 = (ZoneHeap *)ZoneHeap::_alloc(pZVar19,(size_t)pZVar20,(size_t *)&pZStack_a8);
      if (pZVar30 == (ZoneHeap *)0x0) goto LAB_00119880;
      pZVar13 = (ZoneHeap *)((long)pZStack_a8 * 8);
      if ((ZoneHeap *)((long)pZStack_a8 * 8) < pZStack_a8) {
        pZVar13 = pZVar32;
      }
      if (pZVar17 != (ZoneHeap *)0x0) {
        pcStack_c0 = (code *)0x1196a4;
        pZVar20 = pZStack_b0;
        pZVar22 = pZVar30;
        memcpy(pZVar30,pZStack_b0,((ulong)(pZVar17->_slots + 7) >> 6) - 1);
        pZVar32 = pZVar13;
      }
      if (pZStack_b0 == (ZoneHeap *)0x0) {
LAB_001196ba:
        in_R8 = (ulong)uStack_b4;
        pZVar21->_zone = (Zone *)pZVar30;
        pZVar21->_slots[1] = (Slot *)pZVar13;
        bVar4 = true;
        pZVar20 = pZVar19;
        goto LAB_001196c3;
      }
      if (pZVar19->_zone == (Zone *)0x0) goto LAB_0011989e;
      pZVar22 = (ZoneHeap *)pZVar21->_slots[1];
      if ((ZoneHeap *)0x7 < pZVar22) {
        pcStack_c0 = (code *)0x119862;
        ZoneBitVector::_resize();
        pZVar32 = pZVar13;
        goto LAB_001196ba;
      }
LAB_001198a3:
      pcStack_c0 = ZoneBitVector::_append;
      ZoneBitVector::_resize();
      pBVar1 = (Block *)pZVar22->_slots[1];
      pBVar14 = (Block *)0x80;
      if ((Block *)0x7f < pBVar1) {
        if (pBVar1 < (Block *)0x4000001) {
          pBVar14 = (Block *)((long)pBVar1 * 2);
        }
        else {
          pBVar14 = pBVar1 + 0x200000;
        }
      }
      newLength = (Block *)((long)&pZVar22->_slots[0]->next + 1);
      if ((pBVar1 <= pBVar14) || (pBVar14 = newLength, pBVar1 < newLength)) {
        EVar8 = ZoneBitVector::_resize
                          ((ZoneBitVector *)pZVar22,pZVar20,(size_t)newLength,(size_t)pBVar14,
                           SUB81(extraout_RDX_01 & 0xffffffff,0));
        return EVar8;
      }
      uStack_c8 = 0x1198f5;
      pcStack_c0 = (code *)(extraout_RDX_01 & 0xffffffff);
      ZoneBitVector::_append();
      if (extraout_RDX_02 <= pZVar20) {
        return (uint)(extraout_RDX_02 < pZVar20) + (uint)(extraout_RDX_02 < pZVar20) * 2;
      }
      if ((ZoneHeap *)pZVar22->_slots[0] < pZVar20) {
        pZStack_d0 = (ZoneHeap *)0x119a81;
        ZoneBitVector::fill();
LAB_00119a81:
        pZStack_d0 = (ZoneHeap *)0x119a86;
        ZoneBitVector::fill();
LAB_00119a86:
        pZStack_d0 = (ZoneHeap *)0x119a8b;
        ZoneBitVector::fill();
      }
      else {
        if ((ZoneHeap *)pZVar22->_slots[0] < extraout_RDX_02) goto LAB_00119a81;
        pZVar22 = (ZoneHeap *)pZVar22->_zone;
        if (pZVar22 == (ZoneHeap *)0x0) goto LAB_00119a86;
        cVar3 = (char)newLength;
        uVar26 = (ulong)pZVar20 >> 6;
        uVar18 = (uint)pZVar20 & 0x3f;
        pZVar20 = (ZoneHeap *)(ulong)uVar18;
        uVar23 = (ulong)extraout_RDX_02 >> 6;
        uVar9 = (uint)extraout_RDX_02 & 0x3f;
        sVar7 = (sbyte)uVar9;
        if (pZVar20 == (ZoneHeap *)0x0) {
LAB_00119994:
          auVar6 = _DAT_00135a50;
          auVar5 = _DAT_00135a40;
          lVar27 = uVar23 - uVar26;
          if (uVar26 <= uVar23 && lVar27 != 0) {
            lVar28 = lVar27 + -1;
            auVar35._8_4_ = (int)lVar28;
            auVar35._0_8_ = lVar28;
            auVar35._12_4_ = (int)((ulong)lVar28 >> 0x20);
            uVar29 = 0;
            auVar35 = auVar35 ^ _DAT_00135a50;
            do {
              auVar37._8_4_ = (int)uVar29;
              auVar37._0_8_ = uVar29;
              auVar37._12_4_ = (int)(uVar29 >> 0x20);
              auVar34 = (auVar37 | auVar5) ^ auVar6;
              if ((bool)(~(auVar34._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar34._0_4_ ||
                          auVar35._4_4_ < auVar34._4_4_) & 1)) {
                pZVar22->_slots[uVar26 + (uVar29 - 1)] = (Slot *)-((ulong)newLength & 0xff);
              }
              if ((auVar34._12_4_ != auVar35._12_4_ || auVar34._8_4_ <= auVar35._8_4_) &&
                  auVar34._12_4_ <= auVar35._12_4_) {
                pZVar22->_slots[uVar26 + uVar29] = (Slot *)-((ulong)newLength & 0xff);
              }
              uVar29 = uVar29 + 2;
            } while ((lVar27 + 1U & 0xfffffffffffffffe) != uVar29);
          }
          if (((ulong)extraout_RDX_02 & 0x3f) != 0) {
            uVar26 = -1L << sVar7;
            if (cVar3 == '\0') {
              pZVar22->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar22->_slots[uVar23 - 1] & uVar26);
            }
            else {
              pZVar22->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar22->_slots[uVar23 - 1] | ~uVar26);
            }
          }
          return 0;
        }
        sVar11 = (sbyte)uVar18;
        if (uVar26 != uVar23) {
          if (cVar3 == '\0') {
            pZVar22->_slots[uVar26 - 1] =
                 (Slot *)((ulong)pZVar22->_slots[uVar26 - 1] & ~(-1L << sVar11));
          }
          else {
            pZVar22->_slots[uVar26 - 1] =
                 (Slot *)((ulong)pZVar22->_slots[uVar26 - 1] | -1L << sVar11);
          }
          uVar26 = uVar26 + 1;
          goto LAB_00119994;
        }
        if (uVar18 < uVar9) {
          uVar23 = ~(-1L << (sVar7 - sVar11 & 0x3fU)) << sVar11;
          if (cVar3 == '\0') {
            pZVar22->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar22->_slots[uVar26 - 1] & ~uVar23);
          }
          else {
            pZVar22->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar22->_slots[uVar26 - 1] | uVar23);
          }
          return 0;
        }
      }
      pZStack_d0 = (ZoneHeap *)ZoneStackBase::_init;
      ZoneBitVector::fill();
      pZVar2 = pZVar22->_zone;
      pZStack_e8 = pZVar12;
      pZStack_e0 = pZVar21;
      pZStack_d8 = pZVar32;
      pZStack_d0 = pZVar17;
      if (pZVar2 != (Zone *)0x0) {
        if ((Block *)pZVar22->_slots[0] != (Block *)0x0) {
          pBVar14 = (Block *)pZVar22->_slots[0];
          if (pZVar2->_ptr == (uint8_t *)0x0) {
            pZStack_f8 = (ZoneHeap *)ZoneStackBase::_prepareBlock;
            pZVar12 = pZVar20;
            pZVar21 = pZVar22;
            ZoneStackBase::_init();
            pZVar30 = (ZoneHeap *)pZVar21->_zone;
            pZStack_118 = pZVar22;
            pZStack_110 = pZVar19;
            pZStack_108 = pZVar20;
            pZStack_f8 = pZVar17;
            if (pZVar30 == (ZoneHeap *)0x0) {
              ZoneStackBase::_prepareBlock();
            }
            else {
              uVar26 = (ulong)pZVar12 & 0xffffffff;
              pSVar15 = pZVar21->_slots[uVar26];
              if (pSVar15[2].next != pSVar15[3].next) {
                if (pZVar30->_zone != (Zone *)0x0) {
                  pSVar10 = (Slot *)ZoneHeap::_alloc(pZVar30,0x200,&sStack_120);
                  if (pSVar10 == (Slot *)0x0) {
                    return 1;
                  }
                  pSVar10[uVar26].next = (Slot *)0x0;
                  pSVar10[(int)pZVar12 == 0].next = pSVar15;
                  pSVar31 = (Slot *)((long)&pSVar10->next + extraout_RDX_04);
                  pSVar10[2].next = pSVar31;
                  pSVar10[3].next = pSVar31;
                  pSVar15[uVar26].next = pSVar10;
                  pZVar21->_slots[uVar26] = pSVar10;
                  return 0;
                }
                goto LAB_00119bc2;
              }
            }
            ZoneStackBase::_prepareBlock();
LAB_00119bc2:
            ZoneStackBase::_prepareBlock();
            return 1;
          }
          do {
            pBVar1 = pBVar14->next;
            pBVar14->prev = pZVar2[2]._block;
            pZVar2[2]._block = pBVar14;
            pBVar14 = pBVar1;
          } while (pBVar1 != (Block *)0x0);
        }
        pZVar22->_zone = (Zone *)0x0;
        pZVar22->_slots[0] = (Slot *)0x0;
        pZVar22->_slots[1] = (Slot *)0x0;
      }
      EVar8 = 0;
      if (pZVar20 != (ZoneHeap *)0x0) {
        if (pZVar20->_zone == (Zone *)0x0) {
          pZStack_f8 = (ZoneHeap *)0x119b2c;
          ZoneStackBase::_init();
        }
        else {
          pZStack_f8 = (ZoneHeap *)0x119af9;
          pBVar14 = (Block *)ZoneHeap::_alloc(pZVar20,0x200,&sStack_f0);
          if (pBVar14 != (Block *)0x0) {
            puVar33 = (uint8_t *)((long)&pBVar14->prev + extraout_RDX_03);
            pBVar14->prev = (Block *)0x0;
            pBVar14->next = (Block *)0x0;
            pBVar14->size = (size_t)puVar33;
            *(uint8_t **)pBVar14->data = puVar33;
            pZVar22->_zone = (Zone *)pZVar20;
            pZVar22->_slots[0] = (Slot *)pBVar14;
            pZVar22->_slots[1] = (Slot *)pBVar14;
            return 0;
          }
        }
        EVar8 = 1;
      }
      return EVar8;
    }
    sVar7 = (sbyte)((ulong)extraout_RDX_00 & 0x3f);
    if (((ulong)extraout_RDX_00 & 0x3f) == 0) goto LAB_00119827;
    puVar16 = (ulong *)((long)&pZVar21->_zone->_ptr +
                       ((ulong)extraout_RDX_00 >> 3 & 0xfffffffffffffff8));
  }
  *puVar16 = *puVar16 & ~(-1L << sVar7);
LAB_00119827:
  pZVar21->_slots[0] = (Slot *)pZVar12;
  return 0;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  size_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorNoHeapMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(heap->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  void* oldData = _data;
  if (_length)
    ::memcpy(newData, oldData, _length * sizeOfT);

  if (oldData)
    heap->release(oldData, oldCapacity * sizeOfT);

  _capacity = allocatedBytes / sizeOfT;
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}